

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt.cpp
# Opt level: O0

void __thiscall Psbt_EmptyObject_Test::TestBody(Psbt_EmptyObject_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_18;
  CfdException *except_2;
  Message local_658;
  string local_650;
  undefined1 local_630 [8];
  AssertionResult gtest_ar_17;
  Message local_618;
  ByteData local_610;
  string local_5f8;
  undefined1 local_5d8 [8];
  AssertionResult gtest_ar_16;
  Message local_5c0;
  uint32_t local_5b8 [2];
  undefined1 local_5b0 [8];
  AssertionResult gtest_ar_15;
  Message local_598;
  Transaction local_590;
  uint32_t local_550 [2];
  undefined1 local_548 [8];
  AssertionResult gtest_ar_14;
  Message local_530;
  Transaction local_528;
  int32_t local_4e8;
  int local_4e4;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar_13;
  string local_4c8;
  undefined1 local_4a8 [8];
  Psbt from_b64;
  AssertionResult gtest_ar_12;
  CfdException *except_1;
  Message local_428;
  string local_420;
  undefined1 local_400 [8];
  AssertionResult gtest_ar_11;
  Message local_3e8;
  ByteData local_3e0;
  string local_3c8;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar_10;
  Message local_390;
  uint32_t local_388 [2];
  undefined1 local_380 [8];
  AssertionResult gtest_ar_9;
  Message local_368;
  Transaction local_360;
  uint32_t local_320 [2];
  undefined1 local_318 [8];
  AssertionResult gtest_ar_8;
  Message local_300;
  Transaction local_2f8;
  int32_t local_2b8;
  int local_2b4;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_7;
  Psbt obj;
  AssertionResult gtest_ar_6;
  CfdException *except;
  Message local_220;
  uint32_t local_218;
  uint local_214;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_5;
  Message local_1f8;
  string local_1f0;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_4;
  Message local_1b8;
  ByteData local_1b0;
  string local_198;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_3;
  Message local_160;
  uint32_t local_158 [2];
  undefined1 local_150 [8];
  AssertionResult gtest_ar_2;
  Message local_138;
  Transaction local_130;
  uint32_t local_f0;
  uint local_ec;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_1;
  Message local_d0;
  Transaction local_c8;
  int32_t local_88;
  int local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  undefined1 local_60 [8];
  Psbt empty_obj;
  Psbt_EmptyObject_Test *this_local;
  
  empty_obj.base_tx_.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  cfd::core::Psbt::Psbt((Psbt *)local_60);
  local_84 = 2;
  cfd::core::Psbt::GetTransaction(&local_c8,(Psbt *)local_60);
  local_88 = cfd::core::AbstractTransaction::GetVersion(&local_c8.super_AbstractTransaction);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_80,"2","empty_obj.GetTransaction().GetVersion()",&local_84,
             &local_88);
  cfd::core::Transaction::~Transaction(&local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x2c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_ec = 0;
  cfd::core::Psbt::GetTransaction(&local_130,(Psbt *)local_60);
  local_f0 = cfd::core::AbstractTransaction::GetLockTime(&local_130.super_AbstractTransaction);
  testing::internal::EqHelper<true>::Compare<int,unsigned_int>
            (local_e8,"0",(int *)"empty_obj.GetTransaction().GetLockTime()",&local_ec,&local_f0);
  cfd::core::Transaction::~Transaction(&local_130);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x2d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  local_158[1] = 0x13;
  local_158[0] = cfd::core::Psbt::GetDataSize((Psbt *)local_60);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_150,"19","empty_obj.GetDataSize()",(int *)(local_158 + 1),
             local_158);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x2e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  cfd::core::Psbt::GetData(&local_1b0,(Psbt *)local_60);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_198,&local_1b0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_178,"\"70736274ff01000a0200000000000000000000\"",
             "empty_obj.GetData().GetHex().c_str()","70736274ff01000a0200000000000000000000",pcVar2)
  ;
  std::__cxx11::string::~string((string *)&local_198);
  cfd::core::ByteData::~ByteData(&local_1b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x30,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  cfd::core::Psbt::GetBase64_abi_cxx11_(&local_1f0,(Psbt *)local_60);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1d0,"\"cHNidP8BAAoCAAAAAAAAAAAAAA==\"",
             "empty_obj.GetBase64().c_str()","cHNidP8BAAoCAAAAAAAAAAAAAA==",pcVar2);
  std::__cxx11::string::~string((string *)&local_1f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x31,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  local_214 = 0;
  local_218 = cfd::core::Psbt::GetPsbtVersion((Psbt *)local_60);
  testing::internal::EqHelper<true>::Compare<int,unsigned_int>
            (local_210,"0",(int *)"empty_obj.GetPsbtVersion()",&local_214,&local_218);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_220);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&except,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x32,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&except,&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&except);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  cfd::core::Psbt::~Psbt((Psbt *)local_60);
  cfd::core::Psbt::Psbt((Psbt *)&gtest_ar_7.message_,1,100);
  local_2b4 = 1;
  cfd::core::Psbt::GetTransaction(&local_2f8,(Psbt *)&gtest_ar_7.message_);
  local_2b8 = cfd::core::AbstractTransaction::GetVersion(&local_2f8.super_AbstractTransaction);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_2b0,"1","obj.GetTransaction().GetVersion()",&local_2b4,
             &local_2b8);
  cfd::core::Transaction::~Transaction(&local_2f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar1) {
    testing::Message::Message(&local_300);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x39,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_300);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  local_320[1] = 100;
  cfd::core::Psbt::GetTransaction(&local_360,(Psbt *)&gtest_ar_7.message_);
  local_320[0] = cfd::core::AbstractTransaction::GetLockTime(&local_360.super_AbstractTransaction);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_318,"100","obj.GetTransaction().GetLockTime()",
             (int *)(local_320 + 1),local_320);
  cfd::core::Transaction::~Transaction(&local_360);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
  if (!bVar1) {
    testing::Message::Message(&local_368);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_318);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_368);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_368);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
  local_388[1] = 0x13;
  local_388[0] = cfd::core::Psbt::GetDataSize((Psbt *)&gtest_ar_7.message_);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_380,"19","obj.GetDataSize()",(int *)(local_388 + 1),local_388)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
  if (!bVar1) {
    testing::Message::Message(&local_390);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_390);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
  cfd::core::Psbt::GetData(&local_3e0,(Psbt *)&gtest_ar_7.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_3c8,&local_3e0);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_3a8,"\"70736274ff01000a0100000000006400000000\"",
             "obj.GetData().GetHex().c_str()","70736274ff01000a0100000000006400000000",pcVar2);
  std::__cxx11::string::~string((string *)&local_3c8);
  cfd::core::ByteData::~ByteData(&local_3e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
  if (!bVar1) {
    testing::Message::Message(&local_3e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_3e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_3e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
  cfd::core::Psbt::GetBase64_abi_cxx11_(&local_420,(Psbt *)&gtest_ar_7.message_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_400,"\"cHNidP8BAAoBAAAAAABkAAAAAA==\"","obj.GetBase64().c_str()",
             "cHNidP8BAAoBAAAAAABkAAAAAA==",pcVar2);
  std::__cxx11::string::~string((string *)&local_420);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_400);
  if (!bVar1) {
    testing::Message::Message(&local_428);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_400);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&except_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&except_1,&local_428);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&except_1);
    testing::Message::~Message(&local_428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
  cfd::core::Psbt::~Psbt((Psbt *)&gtest_ar_7.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4c8,"cHNidP8BAAoBAAAAAABkAAAAAA==",
             (allocator *)((long)&gtest_ar_13.message_.ptr_ + 7));
  cfd::core::Psbt::Psbt((Psbt *)local_4a8,&local_4c8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_13.message_.ptr_ + 7));
  local_4e4 = 1;
  cfd::core::Psbt::GetTransaction(&local_528,(Psbt *)local_4a8);
  local_4e8 = cfd::core::AbstractTransaction::GetVersion(&local_528.super_AbstractTransaction);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_4e0,"1","from_b64.GetTransaction().GetVersion()",&local_4e4,
             &local_4e8);
  cfd::core::Transaction::~Transaction(&local_528);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
  if (!bVar1) {
    testing::Message::Message(&local_530);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_530);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_530);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
  local_550[1] = 100;
  cfd::core::Psbt::GetTransaction(&local_590,(Psbt *)local_4a8);
  local_550[0] = cfd::core::AbstractTransaction::GetLockTime(&local_590.super_AbstractTransaction);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_548,"100","from_b64.GetTransaction().GetLockTime()",
             (int *)(local_550 + 1),local_550);
  cfd::core::Transaction::~Transaction(&local_590);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_548);
  if (!bVar1) {
    testing::Message::Message(&local_598);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_548);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x46,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_598);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_598);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_548);
  local_5b8[1] = 0x13;
  local_5b8[0] = cfd::core::Psbt::GetDataSize((Psbt *)local_4a8);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_5b0,"19","from_b64.GetDataSize()",(int *)(local_5b8 + 1),
             local_5b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5b0);
  if (!bVar1) {
    testing::Message::Message(&local_5c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x47,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_5c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_5c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5b0);
  cfd::core::Psbt::GetData(&local_610,(Psbt *)local_4a8);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_5f8,&local_610);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_5d8,"\"70736274ff01000a0100000000006400000000\"",
             "from_b64.GetData().GetHex().c_str()","70736274ff01000a0100000000006400000000",pcVar2);
  std::__cxx11::string::~string((string *)&local_5f8);
  cfd::core::ByteData::~ByteData(&local_610);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d8);
  if (!bVar1) {
    testing::Message::Message(&local_618);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x49,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_618);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_618);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d8);
  cfd::core::Psbt::GetBase64_abi_cxx11_(&local_650,(Psbt *)local_4a8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_630,"\"cHNidP8BAAoBAAAAAABkAAAAAA==\"","from_b64.GetBase64().c_str()"
             ,"cHNidP8BAAoBAAAAAABkAAAAAA==",pcVar2);
  std::__cxx11::string::~string((string *)&local_650);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_630);
  if (!bVar1) {
    testing::Message::Message(&local_658);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_630);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&except_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&except_2,&local_658);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&except_2);
    testing::Message::~Message(&local_658);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_630);
  cfd::core::Psbt::~Psbt((Psbt *)local_4a8);
  return;
}

Assistant:

TEST(Psbt, EmptyObject) {
  try {
    Psbt empty_obj;
    EXPECT_EQ(2, empty_obj.GetTransaction().GetVersion());
    EXPECT_EQ(0, empty_obj.GetTransaction().GetLockTime());
    EXPECT_EQ(19, empty_obj.GetDataSize());
    EXPECT_STREQ("70736274ff01000a0200000000000000000000",
        empty_obj.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAAoCAAAAAAAAAAAAAA==", empty_obj.GetBase64().c_str());
    EXPECT_EQ(0, empty_obj.GetPsbtVersion());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  try {
    Psbt obj(1, 100);
    EXPECT_EQ(1, obj.GetTransaction().GetVersion());
    EXPECT_EQ(100, obj.GetTransaction().GetLockTime());
    EXPECT_EQ(19, obj.GetDataSize());
    EXPECT_STREQ("70736274ff01000a0100000000006400000000",
        obj.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAAoBAAAAAABkAAAAAA==", obj.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  try {
    Psbt from_b64("cHNidP8BAAoBAAAAAABkAAAAAA==");
    EXPECT_EQ(1, from_b64.GetTransaction().GetVersion());
    EXPECT_EQ(100, from_b64.GetTransaction().GetLockTime());
    EXPECT_EQ(19, from_b64.GetDataSize());
    EXPECT_STREQ("70736274ff01000a0100000000006400000000",
        from_b64.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAAoBAAAAAABkAAAAAA==", from_b64.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }
}